

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManChoiceMinLevel_rec(Gia_Man_t *p,int iPivot,int fDiveIn,Vec_Int_t *vMap)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  ulong extraout_RDX;
  int iVar9;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar13;
  ulong uVar12;
  
  if ((iPivot < 0) || (p->nObjs <= iPivot)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = p->pObjs;
  if ((~*(uint *)(pGVar2 + (uint)iPivot) & 0x9fffffff) == 0) {
    return 0;
  }
  pVVar3 = p->vLevels;
  Vec_IntFillExtra(pVVar3,iPivot + 1,fDiveIn);
  if (pVVar3->nSize <= iPivot) {
LAB_001fdfe1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pGVar2 = pGVar2 + (uint)iPivot;
  if (pVVar3->pArray[(uint)iPivot] == 0) {
    if (fDiveIn != 0) {
      uVar10 = (ulong)(uint)p->pReprs[(uint)iPivot] & 0xfffffff;
      iVar7 = (int)uVar10;
      if (((uVar10 != 0xfffffff) && (iVar7 != 0)) || (0 < p->pNexts[(uint)iPivot])) {
        if (((~(uint)p->pReprs[uVar10] & 0xfffffff) != 0) ||
           (piVar8 = p->pNexts, piVar8[uVar10] < 1)) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x217,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        uVar12 = 0xffffffff;
        uVar11 = 0xffffffff;
        iVar5 = 1000000000;
        uVar13 = uVar10;
        iVar9 = iVar5;
        if (iVar7 != 0) {
          do {
            iVar5 = Gia_ManChoiceMinLevel_rec(p,(int)uVar13,0,vMap);
            if (iVar5 < iVar9) {
              uVar12 = uVar13;
            }
            uVar11 = (undefined4)uVar12;
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            piVar8 = p->pNexts;
            puVar1 = (uint *)(piVar8 + uVar13);
            uVar13 = (ulong)*puVar1;
            iVar9 = iVar5;
          } while (0 < (int)*puVar1);
          if (iVar5 < 1) {
            __assert_fail("LevMin > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x220,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)"
                         );
          }
        }
        if (iVar7 < vMap->nSize) {
          uVar12 = (ulong)(uint)(iVar7 * 4);
          *(undefined4 *)((long)vMap->pArray + uVar12) = uVar11;
          if (((~*(uint *)(&p->pReprs->field_0x0 + uVar12) & 0xfffffff) != 0) ||
             (piVar8[uVar10] < 1)) {
            __assert_fail("Gia_ObjIsHead(p, iRepr)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x222,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)"
                         );
          }
          if (iVar7 == 0) {
            return iVar5;
          }
          while( true ) {
            pVVar3 = p->vLevels;
            Vec_IntFillExtra(pVVar3,(int)uVar10 + 1,(int)uVar12);
            if (pVVar3->nSize <= (int)uVar10) break;
            pVVar3->pArray[uVar10] = iVar5;
            puVar1 = (uint *)(p->pNexts + uVar10);
            uVar10 = (ulong)*puVar1;
            uVar12 = extraout_RDX;
            if ((int)*puVar1 < 1) {
              return iVar5;
            }
          }
        }
        goto LAB_001fdfa3;
      }
    }
    uVar6 = (uint)*(undefined8 *)pGVar2;
    if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pPivot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x226,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
    }
    iVar5 = Gia_ManChoiceMinLevel_rec(p,iPivot - (uVar6 & 0x1fffffff),1,vMap);
    iVar7 = Gia_ManChoiceMinLevel_rec(p,iPivot - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff),1,vMap);
    if (iVar7 < iVar5) {
      iVar7 = iVar5;
    }
    pGVar4 = p->pObjs;
    if ((pGVar4 <= pGVar2) && (pGVar2 < pGVar4 + p->nObjs)) {
      iVar5 = (int)((long)pGVar2 - (long)pGVar4 >> 2);
      uVar6 = iVar5 * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar6 + 1,iVar5);
      if ((-1 < (int)uVar6) && ((int)uVar6 < pVVar3->nSize)) {
        pVVar3->pArray[uVar6 & 0x7fffffff] = iVar7 + 1;
        return iVar7 + 1;
      }
LAB_001fdfa3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  else {
    pGVar4 = p->pObjs;
    if ((pGVar4 <= pGVar2) && (pGVar2 < pGVar4 + p->nObjs)) {
      iVar7 = (int)((long)pGVar2 - (long)pGVar4 >> 2);
      uVar6 = iVar7 * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar6 + 1,iVar7);
      if ((-1 < (int)uVar6) && ((int)uVar6 < pVVar3->nSize)) {
        return pVVar3->pArray[uVar6 & 0x7fffffff];
      }
      goto LAB_001fdfe1;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManChoiceMinLevel_rec( Gia_Man_t * p, int iPivot, int fDiveIn, Vec_Int_t * vMap )
{
    int Level0, Level1, LevelMax;
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot );
    if ( Gia_ObjIsCi(pPivot) )
        return 0;
    if ( Gia_ObjLevel(p, pPivot) )
        return Gia_ObjLevel(p, pPivot);
    if ( fDiveIn && Gia_ObjIsClass(p, iPivot) )
    {
        int iObj, ObjMin = -1, iRepr = Gia_ObjRepr(p, iPivot), LevMin = ABC_INFINITY;
        Gia_ClassForEachObj( p, iRepr, iObj )
        {
            int LevCur = Gia_ManChoiceMinLevel_rec( p, iObj, 0, vMap );
            if ( LevMin > LevCur )
            {
                LevMin = LevCur;
                ObjMin = iObj;
            }
        }
        assert( LevMin > 0 );
        Vec_IntWriteEntry( vMap, iRepr, ObjMin );
        Gia_ClassForEachObj( p, iRepr, iObj )
            Gia_ObjSetLevelId( p, iObj, LevMin );
        return LevMin;
    }
    assert( Gia_ObjIsAnd(pPivot) );
    Level0 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId0(pPivot, iPivot), 1, vMap );
    Level1 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId1(pPivot, iPivot), 1, vMap );
    LevelMax = 1 + Abc_MaxInt(Level0, Level1);
    Gia_ObjSetLevel( p, pPivot, LevelMax );
    return LevelMax;
}